

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O2

ostream * operator<<(ostream *o,Person *p)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(o,"name-> ");
  poVar1 = std::operator<<(poVar1,(string *)&p->name);
  poVar1 = std::operator<<(poVar1,", id-> ");
  poVar1 = std::operator<<(poVar1,(string *)&p->id);
  poVar1 = std::operator<<(poVar1,", address-> ");
  operator<<(poVar1,&p->address);
  return o;
}

Assistant:

ostream& operator <<(ostream& o, const Person& p) {

    o << "name-> " << p.getName() << ", id-> " << p.getId() << ", address-> " << p.getAddress();
    return o;
}